

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall sf::String::String(String *this,Uint32 utf32Char)

{
  Uint32 utf32Char_local;
  String *this_local;
  
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(&this->m_string);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  operator+=(&this->m_string,utf32Char);
  return;
}

Assistant:

String::String(Uint32 utf32Char)
{
    m_string += utf32Char;
}